

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O0

rfc5444_result
rfc5444_writer_forward_msg
          (rfc5444_writer *writer,rfc5444_reader_tlvblock_context *context,uint8_t *msg,size_t len)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  _func_int_void_ptr_void_ptr *__dest;
  rfc5444_writer_message *extraout_RDX;
  rfc5444_writer_message *extraout_RDX_00;
  rfc5444_writer_message *prVar7;
  rfc5444_reader_tlvblock_context *extraout_RDX_01;
  rfc5444_reader_tlvblock_context *extraout_RDX_02;
  rfc5444_reader_tlvblock_context *extraout_RDX_03;
  rfc5444_reader_tlvblock_context *extraout_RDX_04;
  rfc5444_reader_tlvblock_context *extraout_RDX_05;
  rfc5444_reader_tlvblock_context *prVar8;
  rfc5444_reader_tlvblock_context *extraout_RDX_06;
  size_t *in_R8;
  undefined1 auVar9 [16];
  rfc5444_writer_forward_handler *local_198;
  list_entity *__tempptr_14;
  list_entity *__tempptr_13;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  _Bool shall_forward;
  uint8_t *ptr;
  uint8_t addr_len;
  size_t sStack_88;
  uint8_t flags;
  size_t msg_size;
  size_t generic_size;
  size_t transformer_overhead;
  size_t max;
  int local_60;
  int hoplimit;
  int hopcount;
  int cnt;
  rfc5444_writer_forward_handler *handler;
  rfc5444_writer_message *rfc5444_msg;
  rfc5444_writer_target *target;
  size_t len_local;
  uint8_t *msg_local;
  rfc5444_reader_tlvblock_context *context_local;
  rfc5444_writer *writer_local;
  undefined8 local_18;
  undefined8 local_10;
  
  target = (rfc5444_writer_target *)len;
  len_local = (size_t)msg;
  msg_local = (uint8_t *)context;
  context_local = (rfc5444_reader_tlvblock_context *)writer;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x1d1,
                  "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                 );
  }
  auVar9 = avl_find(&writer->_msgcreators,&context->msg_type);
  local_198 = auVar9._0_8_;
  local_18 = 0;
  if (local_198 == (rfc5444_writer_forward_handler *)0x0) {
    local_198 = (rfc5444_writer_forward_handler *)0x0;
  }
  handler = local_198;
  if (local_198 == (rfc5444_writer_forward_handler *)0x0) {
    writer_local._4_4_ = RFC5444_NO_MSGCREATOR;
  }
  else if (local_198[2].process ==
           (_func_int_rfc5444_writer_forward_handler_ptr_rfc5444_writer_target_ptr_rfc5444_reader_tlvblock_context_ptr_uint8_t_ptr_size_t_ptr
            *)0x0) {
    writer_local._4_4_ = RFC5444_OKAY;
  }
  else {
    bVar4 = false;
    lVar2 = *(long *)&context_local[1].orig_addr._type;
    while( true ) {
      local_10 = auVar9._0_8_;
      rfc5444_msg = (rfc5444_writer_message *)(lVar2 + -0x30);
      if (*(uint8_t **)(lVar2 + 8) == context_local[1].msg_buffer) break;
      uVar5 = (*handler[2].process)
                        ((rfc5444_writer_forward_handler *)rfc5444_msg,
                         (rfc5444_writer_target *)msg_local,auVar9._8_8_,context_local[1].msg_buffer
                         ,in_R8);
      prVar7 = extraout_RDX;
      if ((uVar5 & 1) != 0) {
        bVar4 = true;
        generic_size = 0;
        for (_hopcount = context_local[1].pkt_buffer;
            *(size_t *)(_hopcount + 8) != context_local[1].pkt_size;
            _hopcount = *(uint8_t **)_hopcount) {
          auVar9 = (**(code **)(_hopcount + 0x40))(_hopcount,*(undefined1 *)len_local);
          prVar7 = auVar9._8_8_;
          if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            generic_size = *(ushort *)(_hopcount + 0x3c) + generic_size;
          }
        }
        transformer_overhead = 0;
        if ((((ulong)(rfc5444_msg->_provider_tree).list_head.prev & 1) == 0) &&
           (transformer_overhead =
                 *(long *)(rfc5444_msg->orig_addr + 8) -
                 (long)((rfc5444_msg->_provider_tree).comp +
                       *(long *)&rfc5444_msg->has_seqno +
                       *(long *)&rfc5444_msg->_registered +
                       *(long *)&(rfc5444_msg->_provider_tree).count), prVar7 = rfc5444_msg,
           transformer_overhead < (long)&target->packet_buffer + generic_size)) {
          rfc5444_writer_flush
                    ((rfc5444_writer *)context_local,(rfc5444_writer_target *)rfc5444_msg,false);
          prVar7 = extraout_RDX_00;
        }
        if (((ulong)(rfc5444_msg->_provider_tree).list_head.prev & 1) != 0) {
          _rfc5444_writer_begin_packet
                    ((rfc5444_writer *)context_local,(rfc5444_writer_target *)rfc5444_msg);
          transformer_overhead =
               *(long *)(rfc5444_msg->orig_addr + 8) -
               (long)((rfc5444_msg->_provider_tree).comp +
                     *(long *)&rfc5444_msg->has_seqno +
                     *(long *)&rfc5444_msg->_registered +
                     *(long *)&(rfc5444_msg->_provider_tree).count);
          prVar7 = rfc5444_msg;
        }
        if (transformer_overhead < (long)&target->packet_buffer + generic_size) {
          return RFC5444_FW_MESSAGE_TOO_LONG;
        }
      }
      auVar9._8_8_ = prVar7;
      auVar9._0_8_ = local_10;
      lVar2._0_1_ = (rfc5444_msg->_msgcreator_node).balance;
      lVar2._1_1_ = (rfc5444_msg->_msgcreator_node).follower;
      lVar2._2_6_ = *(undefined6 *)&(rfc5444_msg->_msgcreator_node).field_0x32;
    }
    if (bVar4) {
      memcpy(_msg_buffer,*(void **)(context_local[1].addr._addr + 7),(size_t)target);
      msg_size = (size_t)target;
      prVar8 = extraout_RDX_01;
      for (_hopcount = context_local[1].pkt_buffer;
          *(size_t *)(_hopcount + 8) != context_local[1].pkt_size;
          _hopcount = *(uint8_t **)_hopcount) {
        auVar9 = (**(code **)(_hopcount + 0x40))(_hopcount,*(undefined1 *)len_local);
        prVar8 = auVar9._8_8_;
        if (((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
           ((_hopcount[0x3e] & 1) == 0)) {
          in_R8 = &msg_size;
          iVar6 = (**(code **)(_hopcount + 0x48))(_hopcount,rfc5444_msg,msg_local,_msg_buffer);
          if (iVar6 != 0) {
            return RFC5444_FW_BAD_TRANSFORM;
          }
          prVar8 = extraout_RDX_02;
          if (msg_size == 0) {
            return RFC5444_OKAY;
          }
        }
      }
      bVar1 = *(byte *)(len_local + 1);
      hoplimit = 4;
      local_60 = -1;
      max._4_4_ = -1;
      if ((bVar1 & 0x80) != 0) {
        hoplimit = (byte)((bVar1 & 0xf) + 1) + 4;
      }
      if ((bVar1 & 0x40) != 0) {
        max._4_4_ = hoplimit;
        hoplimit = hoplimit + 1;
      }
      if ((bVar1 & 0x20) != 0) {
        local_60 = hoplimit;
        hoplimit = hoplimit + 1;
      }
      if ((bVar1 & 0x10) != 0) {
        hoplimit = hoplimit + 2;
      }
      if ((max._4_4_ == -1) || (1 < *(byte *)(len_local + (long)max._4_4_))) {
        lVar3 = *(long *)&context_local[1].orig_addr._type;
        while( true ) {
          rfc5444_msg = (rfc5444_writer_message *)(lVar3 + -0x30);
          if (*(uint8_t **)(lVar3 + 8) == context_local[1].msg_buffer) break;
          uVar5 = (*handler[2].process)
                            ((rfc5444_writer_forward_handler *)rfc5444_msg,
                             (rfc5444_writer_target *)msg_local,prVar8,context_local[1].msg_buffer,
                             in_R8);
          prVar8 = extraout_RDX_03;
          if ((uVar5 & 1) != 0) {
            __dest = (rfc5444_msg->_provider_tree).comp +
                     *(long *)&rfc5444_msg->has_seqno +
                     *(long *)&rfc5444_msg->_registered +
                     *(long *)&(rfc5444_msg->_provider_tree).count +
                     (long)&((rfc5444_msg->_provider_tree).root)->list;
            if ((_func_int_void_ptr_void_ptr *)
                ((long)&(((rfc5444_msg->_provider_tree).root)->list).next +
                *(long *)(rfc5444_msg->orig_addr + 8)) < __dest + msg_size) {
              __assert_fail("ptr + generic_size <= target->_pkt.buffer + target->_pkt.max",
                            "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                            ,0x244,
                            "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                           );
            }
            memcpy(__dest,(void *)len_local,msg_size);
            sStack_88 = msg_size;
            prVar8 = extraout_RDX_04;
            for (_hopcount = context_local[1].pkt_buffer;
                *(size_t *)(_hopcount + 8) != context_local[1].pkt_size;
                _hopcount = *(uint8_t **)_hopcount) {
              auVar9 = (**(code **)(_hopcount + 0x40))(_hopcount,*(undefined1 *)len_local);
              prVar8 = auVar9._8_8_;
              if (((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                 ((_hopcount[0x3e] & 1) != 0)) {
                in_R8 = &stack0xffffffffffffff78;
                iVar6 = (**(code **)(_hopcount + 0x48))(_hopcount,rfc5444_msg,msg_local,__dest);
                if (iVar6 != 0) {
                  return RFC5444_FW_BAD_TRANSFORM;
                }
                prVar8 = extraout_RDX_05;
                if (sStack_88 == 0) break;
              }
            }
            if (sStack_88 != 0) {
              *(size_t *)&rfc5444_msg->has_seqno = sStack_88 + *(long *)&rfc5444_msg->has_seqno;
              __dest[2] = SUB81(sStack_88 >> 8,0);
              __dest[3] = SUB81(sStack_88,0);
              if (max._4_4_ != -1) {
                prVar8 = (rfc5444_reader_tlvblock_context *)
                         CONCAT71((int7)((ulong)prVar8 >> 8),(char)__dest[max._4_4_] + -1);
                __dest[max._4_4_] = (_func_int_void_ptr_void_ptr)((char)__dest[max._4_4_] + -1);
              }
              if (local_60 != -1) {
                prVar8 = (rfc5444_reader_tlvblock_context *)
                         CONCAT71((int7)((ulong)prVar8 >> 8),(char)__dest[local_60] + '\x01');
                __dest[local_60] = (_func_int_void_ptr_void_ptr)((char)__dest[local_60] + '\x01');
              }
              if (context_local->pkt_size != 0) {
                (*(code *)context_local->pkt_size)(rfc5444_msg);
                prVar8 = extraout_RDX_06;
              }
            }
          }
          lVar3._0_1_ = (rfc5444_msg->_msgcreator_node).balance;
          lVar3._1_1_ = (rfc5444_msg->_msgcreator_node).follower;
          lVar3._2_6_ = *(undefined6 *)&(rfc5444_msg->_msgcreator_node).field_0x32;
        }
        writer_local._4_4_ = RFC5444_OKAY;
      }
      else {
        writer_local._4_4_ = RFC5444_OKAY;
      }
    }
    else {
      writer_local._4_4_ = RFC5444_OKAY;
    }
  }
  return writer_local._4_4_;
}

Assistant:

enum rfc5444_result
rfc5444_writer_forward_msg(
  struct rfc5444_writer *writer, struct rfc5444_reader_tlvblock_context *context, const uint8_t *msg, size_t len)
{
  struct rfc5444_writer_target *target;
  struct rfc5444_writer_message *rfc5444_msg;
  struct rfc5444_writer_forward_handler *handler;
  int cnt, hopcount, hoplimit;
  size_t max, transformer_overhead;
  size_t generic_size, msg_size;
  uint8_t flags, addr_len;
  uint8_t *ptr;
  bool shall_forward;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  rfc5444_msg = avl_find_element(&writer->_msgcreators, &context->msg_type, rfc5444_msg, _msgcreator_node);
  if (rfc5444_msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  if (!rfc5444_msg->forward_target_selector) {
    /* no forwarding handler, do not forward */
    return RFC5444_OKAY;
  }

  /* 1.) first flush all interfaces that have (too) full buffers */
  shall_forward = false;
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    shall_forward = true;
    transformer_overhead = 0;
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0])) {
        transformer_overhead += handler->allocate_space;
      }
    }

    max = 0;
    if (!target->_is_flushed) {
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);

      if (len + transformer_overhead > max) {
        /* flush the old packet */
        rfc5444_writer_flush(writer, target, false);
      }
    }

    if (target->_is_flushed) {
      /* begin a new packet */
      _rfc5444_writer_begin_packet(writer, target);
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);
    }

    if (len + transformer_overhead > max) {
      /* message too long, too much data in it */
      return RFC5444_FW_MESSAGE_TOO_LONG;
    }
  }

  if (!shall_forward) {
    /* no target to forward message, everything done */
    return RFC5444_OKAY;
  }

  /* 2.) generate message and do non-target specific post processors */
  ptr = _msg_buffer;
  memcpy(ptr, writer->_msg.buffer, len);

  /* remember length */
  generic_size = len;

  /* run processors (unpspecific) forwarding processors */
  avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
    if (handler->is_matching_signature(handler, msg[0]) && !handler->target_specific) {
      if (handler->process(handler, target, context, _msg_buffer, &generic_size)) {
        /* error, we have not modified the _bin_msgs_size, so we can just return */
        return RFC5444_FW_BAD_TRANSFORM;
      }

      if (generic_size == 0) {
        return RFC5444_OKAY;
      }
    }
  }

  /* 3) grab index of header structures */
  flags = msg[1];
  addr_len = (flags & RFC5444_MSG_FLAG_ADDRLENMASK) + 1;

  cnt = 4;
  hopcount = -1;
  hoplimit = -1;

  if ((flags & RFC5444_MSG_FLAG_ORIGINATOR) != 0) {
    cnt += addr_len;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPLIMIT) != 0) {
    hoplimit = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPCOUNT) != 0) {
    hopcount = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_SEQNO) != 0) {
    cnt += 2;
  }

  if (hoplimit != -1 && msg[hoplimit] <= 1) {
    /* do not forward a message with hopcount 1 or 0 */
    return RFC5444_OKAY;
  }

  /* forward message */
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    ptr =
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size];

    /* copy message into packet buffer */
    assert(ptr + generic_size <= target->_pkt.buffer + target->_pkt.max);
    memcpy(ptr, msg, generic_size);

    /* remember position of first copy */
    msg_size = generic_size;

    /* run processors */
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0]) && handler->target_specific) {
        if (handler->process(handler, target, context, ptr, &msg_size)) {
          /* error, we have not modified the _bin_msgs_size, so we can just return */
          return RFC5444_FW_BAD_TRANSFORM;
        }
        if (msg_size == 0) {
          break;
        }
      }
    }

    if (msg_size > 0) {
      target->_bin_msgs_size += msg_size;

      /* correct message */
      ptr[2] = msg_size >> 8;
      ptr[3] = msg_size & 0xff;

      /* correct hoplimit if necesssary */
      if (hoplimit != -1) {
        ptr[hoplimit]--;
      }

      /* correct hopcount if necessary */
      if (hopcount != -1) {
        ptr[hopcount]++;
      }

      if (writer->message_generation_notifier) {
        writer->message_generation_notifier(target);
      }
    }
  }
  return RFC5444_OKAY;
}